

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O2

int __thiscall
Js::ByteCodeBufferBuilder::GetIdOfPropertyRecord
          (ByteCodeBufferBuilder *this,PropertyRecord *propertyRecord)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  PropertyRecord *in_RAX;
  undefined4 *puVar5;
  ByteBuffer *bb;
  uint propertyNameLength;
  PropertyRecord *local_38;
  PropertyRecord *propertyRecordCheck;
  
  local_38 = in_RAX;
  if (propertyRecord->isSymbol == true) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x34b,"(!propertyRecord->IsSymbol())",
                                "bytecode serializer does not currently handle non-built-in symbol PropertyRecords"
                               );
    if (!bVar3) goto LAB_007b5eb3;
    *puVar5 = 0;
  }
  uVar1 = propertyRecord->byteCount;
  propertyNameLength = uVar1 >> 1;
  if (propertyNameLength == 0x7fffffff) {
    Throw::InternalError();
  }
  ScriptContext::FindPropertyRecord
            (this->scriptContext,(LPCWSTR)(propertyRecord + 1),propertyNameLength,&local_38);
  if (local_38 != propertyRecord) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x356,"(propertyRecordCheck == propertyRecord)",
                                "propertyRecordCheck == propertyRecord");
    if (!bVar3) {
LAB_007b5eb3:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  bb = (ByteBuffer *)new<Memory::ArenaAllocator>(0x10,this->alloc,0x35916e);
  bb->byteCount = (uVar1 & 0xfffffffe) + 2;
  (bb->field_1).s16 = (char16 *)(propertyRecord + 1);
  iVar4 = GetString16Id(this,bb,true);
  return iVar4;
}

Assistant:

int GetIdOfPropertyRecord(const PropertyRecord * propertyRecord)
    {
        AssertMsg(!propertyRecord->IsSymbol(), "bytecode serializer does not currently handle non-built-in symbol PropertyRecords");
        size_t byteCount = ((size_t)propertyRecord->GetLength() + 1) * sizeof(char16);
        if (byteCount > UINT_MAX)
        {
            // We should never see property record that big
            Js::Throw::InternalError();
        }
        auto buffer = propertyRecord->GetBuffer();
#if DBG
        const PropertyRecord * propertyRecordCheck;
        scriptContext->FindPropertyRecord(buffer, propertyRecord->GetLength(), &propertyRecordCheck);
        Assert(propertyRecordCheck == propertyRecord);
#endif
        auto bb = Anew(alloc, ByteBuffer, (uint32)byteCount, (void*)buffer);
        return GetString16Id(bb, /*isPropertyRecord=*/ true);
    }